

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignals::BlockConnected
          (ValidationSignals *this,ChainstateRole role,shared_ptr<const_CBlock> *pblock,
          CBlockIndex *pindex)

{
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar1;
  bool bVar2;
  _func_void *p_Var3;
  shared_ptr<const_CBlock> *psVar4;
  shared_ptr<const_CBlock> *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  char *local_name;
  anon_class_40_4_bc35ff05_for_event event;
  undefined1 local_98 [32];
  undefined4 local_78 [2];
  __shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> local_70;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  uint256 local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &event.pblock;
  psVar4 = pblock;
  event.role = role;
  std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&this_00->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>,
             &pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
  local_name = "BlockConnected";
  event.pindex = pindex;
  event.this = this;
  bVar2 = ::LogAcceptCategory((LogFlags)this_00,(Level)psVar4);
  local_98._0_8_ = "BlockConnected";
  if (bVar2) {
    CBlockHeader::GetHash
              (&local_50,
               &((pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_CBlockHeader);
    base_blob<256u>::ToString_abi_cxx11_((string *)local_98,(base_blob<256u> *)&local_50);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x67;
    logging_function._M_str = "BlockConnected";
    logging_function._M_len = 0xe;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,int>
              (logging_function,source_file,0xda,VALIDATION,Debug,
               (ConstevalFormatString<3U>)0xcd68d3,&local_name,(string *)local_98,&pindex->nHeight);
    std::__cxx11::string::~string((string *)local_98);
    local_98._0_8_ = local_name;
  }
  uVar1._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8),
             &pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
  local_98._24_8_ = pindex;
  BlockConnected(ChainstateRole,std::shared_ptr<CBlock_const>const&,CBlockIndex_const*)::$_1::__1
            ((__1 *)local_78,&event);
  local_d8 = (code *)0x0;
  pcStack_d0 = (code *)0x0;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  p_Var3 = (_func_void *)operator_new(0x48);
  *(undefined8 *)p_Var3 = local_98._0_8_;
  std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 8),
             (__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  *(undefined8 *)(p_Var3 + 0x18) = local_98._24_8_;
  *(undefined4 *)(p_Var3 + 0x20) = local_78[0];
  std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 0x28),&local_70);
  *(undefined4 *)(p_Var3 + 0x38) = local_60;
  *(undefined4 *)(p_Var3 + 0x3c) = uStack_5c;
  *(undefined4 *)(p_Var3 + 0x40) = uStack_58;
  *(undefined4 *)(p_Var3 + 0x44) = uStack_54;
  pcStack_d0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:216:5)>
               ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:216:5)>
             ::_M_manager;
  local_e8._M_unused._0_8_ = (undefined8)p_Var3;
  (**(code **)(*(long *)uVar1._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar1._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  BlockConnected(ChainstateRole,std::shared_ptr<CBlock_const>const&,CBlockIndex_const*)::$_0::~__0
            ((__0 *)local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&event.pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::BlockConnected(ChainstateRole role, const std::shared_ptr<const CBlock> &pblock, const CBlockIndex *pindex) {
    auto event = [role, pblock, pindex, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.BlockConnected(role, pblock, pindex); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: block hash=%s block height=%d", __func__,
                          pblock->GetHash().ToString(),
                          pindex->nHeight);
}